

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregion.cpp
# Opt level: O0

void loadAET(EdgeTableEntry *AET,EdgeTableEntry *ETEs)

{
  _EdgeTableEntry *p_Var1;
  bool bVar2;
  EdgeTableEntry *tmp;
  EdgeTableEntry *pPrevAET;
  EdgeTableEntry *ETEs_local;
  EdgeTableEntry *AET_local;
  
  AET_local = AET->next;
  pPrevAET = AET;
  ETEs_local = ETEs;
  while (ETEs_local != (EdgeTableEntry *)0x0) {
    while( true ) {
      bVar2 = false;
      if (AET_local != (EdgeTableEntry *)0x0) {
        bVar2 = (AET_local->bres).minor_axis < (ETEs_local->bres).minor_axis;
      }
      if (!bVar2) break;
      pPrevAET = AET_local;
      AET_local = AET_local->next;
    }
    p_Var1 = ETEs_local->next;
    ETEs_local->next = AET_local;
    if (AET_local != (EdgeTableEntry *)0x0) {
      AET_local->back = ETEs_local;
    }
    ETEs_local->back = pPrevAET;
    pPrevAET->next = ETEs_local;
    pPrevAET = ETEs_local;
    ETEs_local = p_Var1;
  }
  return;
}

Assistant:

static void loadAET(EdgeTableEntry *AET, EdgeTableEntry *ETEs)
{
    EdgeTableEntry *pPrevAET;
    EdgeTableEntry *tmp;

    pPrevAET = AET;
    AET = AET->next;
    while (ETEs) {
        while (AET && AET->bres.minor_axis < ETEs->bres.minor_axis) {
            pPrevAET = AET;
            AET = AET->next;
        }
        tmp = ETEs->next;
        ETEs->next = AET;
        if (AET)
            AET->back = ETEs;
        ETEs->back = pPrevAET;
        pPrevAET->next = ETEs;
        pPrevAET = ETEs;

        ETEs = tmp;
    }
}